

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O3

ColumnList *
duckdb::ColumnList::Deserialize(ColumnList *__return_storage_ptr__,Deserializer *deserializer)

{
  int iVar1;
  vector<duckdb::ColumnDefinition,_true> columns;
  vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_> local_78;
  vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_> local_58;
  vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_> local_38;
  
  iVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,100,"columns");
  if ((char)iVar1 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_78.super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_38.super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38.super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>::~vector
              (&local_38);
  }
  else {
    Deserializer::Read<duckdb::vector<duckdb::ColumnDefinition,true>>
              ((type *)&local_78,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  local_58.super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_78.
       super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_58.super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_78.
       super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_58.super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_78.
       super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_78.super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ColumnList(__return_storage_ptr__,(vector<duckdb::ColumnDefinition,_true> *)&local_58,false);
  ::std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>::~vector
            (&local_58);
  ::std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>::~vector
            (&local_78);
  return __return_storage_ptr__;
}

Assistant:

ColumnList ColumnList::Deserialize(Deserializer &deserializer) {
	auto columns = deserializer.ReadPropertyWithDefault<vector<ColumnDefinition>>(100, "columns");
	ColumnList result(std::move(columns));
	return result;
}